

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O3

void __thiscall EventQueue::SendEvent(EventQueue *this,Event *ev)

{
  int *piVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *pNVar4;
  AutoLock _auto_lock_;
  AutoLock local_30;
  
  AutoLock::AutoLock(&local_30,&this->mLock,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventQueue.cpp"
                     ,0x32);
  pthread_mutex_lock((pthread_mutex_t *)&Mutex::mCriticalSection);
  piVar1 = &(ev->super_RefCount).mRefCount;
  *piVar1 = *piVar1 + 1;
  pthread_mutex_unlock((pthread_mutex_t *)&Mutex::mCriticalSection);
  if (ev->mPriority == 0) {
    pNVar4 = (Node *)operator_new(0x18,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/include/jh_list.h"
                                  ,0xa7);
LAB_00116d22:
    pNVar4->val = ev;
    pNVar2 = (this->mQueue).mTail;
    pNVar3 = pNVar2->prev;
    pNVar4->prev = pNVar3;
    pNVar4->next = pNVar2;
    pNVar3->next = pNVar4;
    pNVar2->prev = pNVar4;
  }
  else {
    pNVar4 = (this->mQueue).mHead;
    do {
      pNVar4 = pNVar4->next;
      if (pNVar4 == (this->mQueue).mTail) {
        pNVar4 = (Node *)operator_new(0x18,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/include/jh_list.h"
                                      ,0xa7);
        goto LAB_00116d22;
      }
    } while (ev->mPriority <= pNVar4->val->mPriority);
    pNVar4 = pNVar4->prev;
    pNVar3 = (Node *)operator_new(0x18);
    pNVar3->val = ev;
    pNVar3->prev = pNVar4;
    pNVar2 = pNVar4->next;
    pNVar3->next = pNVar2;
    pNVar2->prev = pNVar3;
    pNVar4->next = pNVar3;
  }
  Condition::Signal(&this->mWait);
  AutoLock::~AutoLock(&local_30);
  return;
}

Assistant:

void EventQueue::SendEvent( Event *ev )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	
	DebugAutoLock( mLock );
	
	ev->AddRef();

	if ( ev->getPriority() == PRIORITY_NORMAL )
	{
		mQueue.push_back( ev );
	}
	else
	{
		int done = false;
		for (JetHead::list<Event*>::iterator i = mQueue.begin(); i != mQueue.end(); ++i)
		{
			if (ev->getPriority() > (*i)->getPriority())
			{
				i.insertBefore(ev);
				done = true;
				break;
			}
		}

		// if we didn't put the event in the list, we add it to the end.
		//  this will happend if all events in the list are of greater priority.
		if ( !done )
		{
			mQueue.push_back( ev );
		}
	}
	
	LOG( "queue size %d", mQueue.size() );	

	mWait.Signal();
}